

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskamain.c
# Opt level: O1

matroska_cuepoint * MATROSKA_CuesGetTimestampStart(ebml_element *Cues,mkv_timestamp_t Timestamp)

{
  matroska_cuepoint *Cue;
  ebml_context *Context;
  bool_t bVar1;
  mkv_timestamp_t mVar2;
  matroska_cuepoint *pmVar3;
  
  if (Cues == (ebml_element *)0x0) {
    __assert_fail("Cues!=NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                  ,0x88c,
                  "matroska_cuepoint *MATROSKA_CuesGetTimestampStart(const ebml_element *, mkv_timestamp_t)"
                 );
  }
  Context = MATROSKA_getContextCues();
  bVar1 = EBML_ElementIsType(Cues,Context);
  if (bVar1 != 0) {
    if (Timestamp == 0x7fffffffffffffff) {
      pmVar3 = (matroska_cuepoint *)0x0;
    }
    else {
      Cue = (matroska_cuepoint *)(Cues->Base).Children;
      if ((Cue == (matroska_cuepoint *)0x0) ||
         (mVar2 = MATROSKA_CueTimestamp(Cue), Timestamp < mVar2)) {
        pmVar3 = (matroska_cuepoint *)0x0;
      }
      else {
        do {
          pmVar3 = Cue;
          Cue = (matroska_cuepoint *)(pmVar3->Base).Base.Base.Next;
          if (pmVar3 == Cue) {
            __assert_fail("(nodetree*)(Elt) != ((nodetree*)(Elt))->Next",
                          "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                          ,0x891,
                          "matroska_cuepoint *MATROSKA_CuesGetTimestampStart(const ebml_element *, mkv_timestamp_t)"
                         );
          }
        } while ((Cue != (matroska_cuepoint *)0x0) &&
                (mVar2 = MATROSKA_CueTimestamp(Cue), mVar2 <= Timestamp));
      }
      if (pmVar3 == (matroska_cuepoint *)0x0) {
        pmVar3 = (matroska_cuepoint *)(Cues->Base).Children;
      }
    }
    return pmVar3;
  }
  __assert_fail("EBML_ElementIsType(Cues, MATROSKA_getContextCues())",
                "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                ,0x88d,
                "matroska_cuepoint *MATROSKA_CuesGetTimestampStart(const ebml_element *, mkv_timestamp_t)"
               );
}

Assistant:

matroska_cuepoint *MATROSKA_CuesGetTimestampStart(const ebml_element *Cues, mkv_timestamp_t Timestamp)
{
    matroska_cuepoint *Elt,*Prev=NULL;

    assert(Cues!=NULL);
    assert(EBML_ElementIsType(Cues, MATROSKA_getContextCues()));
    if (Timestamp==INVALID_TIMESTAMP_T)
        return NULL;

    for (Elt=(matroska_cuepoint*)EBML_MasterChildren(Cues);Elt;Prev=Elt, Elt=(matroska_cuepoint*)EBML_MasterNext(Elt))
    {
        if (MATROSKA_CueTimestamp(Elt) > Timestamp)
            break;
    }

    return Prev ? Prev : (matroska_cuepoint*)EBML_MasterChildren(Cues);
}